

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create_unk34(nvrm_ioctl_create_unk34 *s)

{
  uint uVar1;
  uint32_t status;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("cid");
    if (iVar2 != 0) goto LAB_00258daa;
  }
  else {
LAB_00258daa:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("handle");
    if (iVar2 != 0) goto LAB_00258df0;
  }
  else {
LAB_00258df0:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar3,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  uVar1 = s->parent;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("parent");
    if (iVar2 != 0) goto LAB_00258e43;
  }
  else {
LAB_00258e43:
    fprintf(_stdout,"%sparent: 0x%08x",nvrm_pfx,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  uVar1 = s->cid2;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("cid2");
    if (iVar2 != 0) goto LAB_00258e9a;
  }
  else {
LAB_00258e9a:
    fprintf(_stdout,"%scid2: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle2;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("handle2");
    if (iVar2 != 0) goto LAB_00258ee0;
  }
  else {
LAB_00258ee0:
    fprintf(_stdout,"%shandle2: 0x%08x",pcVar3,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid2,s->handle2,"handle2");
  }
  uVar1 = s->unk14;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("unk14");
    if (iVar2 != 0) goto LAB_00258f34;
  }
  else {
LAB_00258f34:
    fprintf(_stdout,"%sunk14: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  status = s->status;
  if (status == 0) {
    iVar2 = _nvrm_field_enabled("status");
    if (iVar2 == 0) goto LAB_00258fad;
  }
  __stream = _stdout;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar3,nvrm_status::buf);
  pcVar3 = nvrm_sep;
LAB_00258fad:
  nvrm_pfx = pcVar3;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_unk34(struct nvrm_ioctl_create_unk34 *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_cid(s, cid2);
	nvrm_print_handle(s, handle2, cid2);
	nvrm_print_x32(s, unk14);
	nvrm_print_status(s, status);
	nvrm_print_ln();
}